

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
pdqsort_detail::
partition_right<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_24_3_1824b316 comp)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a;
  bool bVar1;
  undefined1 uVar2;
  reference piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var4;
  int *in_RSI;
  int *in_RDI;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pivot_pos;
  bool already_partitioned;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  T pivot;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int iVar6;
  undefined4 in_stack_ffffffffffffff74;
  int iVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff78;
  byte local_79;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  int *local_58;
  undefined8 in_stack_ffffffffffffffb0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  int local_24;
  int *local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18 [3];
  
  local_20 = in_RSI;
  local_18[0]._M_current = in_RDI;
  piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (local_18);
  local_24 = *piVar3;
  local_30._M_current = local_18[0]._M_current;
  local_38._M_current = local_20;
  do {
    p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator++(&local_30);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*(p_Var4);
    bVar1 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                      ((anon_class_24_3_1824b316 *)
                       CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                       (HighsInt)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                       (HighsInt)in_stack_ffffffffffffffb0);
  } while (bVar1);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
            (in_stack_ffffffffffffff78,CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
            );
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff68._M_current);
  if (bVar1) {
    do {
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff68._M_current);
      local_79 = 0;
      if (bVar1) {
        p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator--(&local_38);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (p_Var4);
        bVar1 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                          ((anon_class_24_3_1824b316 *)
                           CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                           (HighsInt)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                           (HighsInt)in_stack_ffffffffffffffb0);
        local_79 = bVar1 ^ 0xff;
      }
    } while ((local_79 & 1) != 0);
  }
  else {
    do {
      p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator--(&local_38);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (p_Var4);
      bVar1 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                        ((anon_class_24_3_1824b316 *)
                         CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                         (HighsInt)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                         (HighsInt)in_stack_ffffffffffffffb0);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  uVar2 = __gnu_cxx::operator>=
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff68._M_current);
  while (bVar1 = __gnu_cxx::operator<
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_ffffffffffffff68._M_current), bVar1) {
    local_58 = local_38._M_current;
    __a._M_current._4_4_ = in_stack_ffffffffffffff74;
    __a._M_current._0_4_ = in_stack_ffffffffffffff70;
    _Var8._M_current = local_30._M_current;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (__a,in_stack_ffffffffffffff68);
    do {
      p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++(&local_30);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (p_Var4);
      bVar1 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                        ((anon_class_24_3_1824b316 *)CONCAT17(uVar2,in_stack_ffffffffffffffb8),
                         (HighsInt)((ulong)_Var8._M_current >> 0x20),(HighsInt)_Var8._M_current);
    } while (bVar1);
    do {
      p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator--(&local_38);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (p_Var4);
      bVar1 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                        ((anon_class_24_3_1824b316 *)CONCAT17(uVar2,in_stack_ffffffffffffffb8),
                         (HighsInt)((ulong)_Var8._M_current >> 0x20),(HighsInt)_Var8._M_current);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_60 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                       (in_stack_ffffffffffffff78,
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  p_Var4 = &local_60;
  piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (p_Var4);
  iVar6 = *piVar3;
  piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (local_18);
  *piVar3 = iVar6;
  iVar7 = local_24;
  piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (p_Var4);
  *piVar3 = iVar7;
  pVar5 = std::
          make_pair<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>&,bool&>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(iVar7,iVar6),(bool *)in_stack_ffffffffffffff68._M_current);
  return pVar5;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }